

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimfmtprops.h
# Opt level: O3

void __thiscall
icu_63::number::impl::DecimalFormatProperties::~DecimalFormatProperties
          (DecimalFormatProperties *this)

{
  CurrencyPluralInfo *pCVar1;
  
  UnicodeString::~UnicodeString(&this->positiveSuffixPattern);
  UnicodeString::~UnicodeString(&this->positiveSuffix);
  UnicodeString::~UnicodeString(&this->positivePrefixPattern);
  UnicodeString::~UnicodeString(&this->positivePrefix);
  UnicodeString::~UnicodeString(&this->padString);
  UnicodeString::~UnicodeString(&this->negativeSuffixPattern);
  UnicodeString::~UnicodeString(&this->negativeSuffix);
  UnicodeString::~UnicodeString(&this->negativePrefixPattern);
  UnicodeString::~UnicodeString(&this->negativePrefix);
  pCVar1 = (this->currencyPluralInfo).fPtr.super_LocalPointerBase<icu_63::CurrencyPluralInfo>.ptr;
  if (pCVar1 != (CurrencyPluralInfo *)0x0) {
    (*(pCVar1->super_UObject)._vptr_UObject[1])();
  }
  CurrencyUnit::~CurrencyUnit(&(this->currency).fValue);
  return;
}

Assistant:

struct U_I18N_API DecimalFormatProperties : public UMemory {

  public:
    NullableValue<UNumberCompactStyle> compactStyle;
    NullableValue<CurrencyUnit> currency;
    CurrencyPluralInfoWrapper currencyPluralInfo;
    NullableValue<UCurrencyUsage> currencyUsage;
    bool decimalPatternMatchRequired;
    bool decimalSeparatorAlwaysShown;
    bool exponentSignAlwaysShown;
    bool formatFailIfMoreThanMaxDigits; // ICU4C-only
    int32_t formatWidth;
    int32_t groupingSize;
    bool groupingUsed;
    int32_t magnitudeMultiplier; // internal field like multiplierScale but separate to avoid conflict
    int32_t maximumFractionDigits;
    int32_t maximumIntegerDigits;
    int32_t maximumSignificantDigits;
    int32_t minimumExponentDigits;
    int32_t minimumFractionDigits;
    int32_t minimumGroupingDigits;
    int32_t minimumIntegerDigits;
    int32_t minimumSignificantDigits;
    int32_t multiplier;
    int32_t multiplierScale; // ICU4C-only
    UnicodeString negativePrefix;
    UnicodeString negativePrefixPattern;
    UnicodeString negativeSuffix;
    UnicodeString negativeSuffixPattern;
    NullableValue<PadPosition> padPosition;
    UnicodeString padString;
    bool parseCaseSensitive;
    bool parseIntegerOnly;
    NullableValue<ParseMode> parseMode;
    bool parseNoExponent;
    bool parseToBigDecimal; // TODO: Not needed in ICU4C?
    UNumberFormatAttributeValue parseAllInput; // ICU4C-only
    //PluralRules pluralRules;
    UnicodeString positivePrefix;
    UnicodeString positivePrefixPattern;
    UnicodeString positiveSuffix;
    UnicodeString positiveSuffixPattern;
    double roundingIncrement;
    NullableValue<RoundingMode> roundingMode;
    int32_t secondaryGroupingSize;
    bool signAlwaysShown;

    DecimalFormatProperties();

    inline bool operator==(const DecimalFormatProperties& other) const {
        return _equals(other, false);
    }

    void clear();

    /**
     * Checks for equality to the default DecimalFormatProperties, but ignores the prescribed set of
     * options for fast-path formatting.
     */
    bool equalsDefaultExceptFastFormat() const;

  private:
    bool _equals(const DecimalFormatProperties& other, bool ignoreForFastFormat) const;
}